

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode LocalizedText_decodeBinary(UA_LocalizedText *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  byte bVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  
  pUVar1 = pos + 1;
  UVar3 = 0x80070000;
  if (pUVar1 <= end) {
    bVar2 = *pos;
    UVar3 = 0;
    pos = pUVar1;
    if ((bVar2 & 1) != 0) {
      UVar3 = Array_decodeBinary(&(dst->locale).data,(size_t *)dst,UA_TYPES + 2);
    }
    if ((bVar2 & 2) != 0) {
      UVar4 = Array_decodeBinary(&(dst->text).data,&(dst->text).length,UA_TYPES + 2);
      UVar3 = UVar3 | UVar4;
    }
  }
  return UVar3;
}

Assistant:

static UA_StatusCode
LocalizedText_decodeBinary(UA_LocalizedText *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encoding = 0;
    UA_StatusCode retval = Byte_decodeBinary(&encoding, NULL);

    /* Decode the content */
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE)
        retval |= String_decodeBinary(&dst->locale, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT)
        retval |= String_decodeBinary(&dst->text, NULL);
    return retval;
}